

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O1

void __thiscall
sc_core::sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>::sc_signal_t
          (sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1> *this,void **vtt,char *name_,
          sc_logic *initial_value_)

{
  sc_signal_in_if<sc_dt::sc_logic> sVar1;
  sc_signal_write_if<sc_dt::sc_logic> sVar2;
  
  sVar1 = *(sc_signal_in_if<sc_dt::sc_logic> *)(vtt + 2);
  (this->super_sc_signal_inout_if<sc_dt::sc_logic>).super_sc_signal_in_if<sc_dt::sc_logic> = sVar1;
  *(void **)(&(this->super_sc_signal_inout_if<sc_dt::sc_logic>).
              super_sc_signal_in_if<sc_dt::sc_logic>.field_0x0 + *(long *)((long)sVar1 + -0x30)) =
       vtt[3];
  sVar2 = *(sc_signal_write_if<sc_dt::sc_logic> *)(vtt + 4);
  (this->super_sc_signal_inout_if<sc_dt::sc_logic>).super_sc_signal_write_if<sc_dt::sc_logic> =
       sVar2;
  *(void **)(&(this->super_sc_signal_inout_if<sc_dt::sc_logic>).
              super_sc_signal_write_if<sc_dt::sc_logic>.field_0x0 + *(long *)((long)sVar2 + -0x30))
       = vtt[5];
  sVar1 = *(sc_signal_in_if<sc_dt::sc_logic> *)(vtt + 1);
  (this->super_sc_signal_inout_if<sc_dt::sc_logic>).super_sc_signal_in_if<sc_dt::sc_logic> = sVar1;
  *(void **)(&(this->super_sc_signal_inout_if<sc_dt::sc_logic>).
              super_sc_signal_in_if<sc_dt::sc_logic>.field_0x0 + *(long *)((long)sVar1 + -0x30)) =
       vtt[6];
  (this->super_sc_signal_inout_if<sc_dt::sc_logic>).super_sc_signal_write_if<sc_dt::sc_logic> =
       *(sc_signal_write_if<sc_dt::sc_logic> *)(vtt + 7);
  sc_prim_channel::sc_prim_channel(&(this->super_sc_signal_channel).super_sc_prim_channel,name_);
  (this->super_sc_signal_channel).super_sc_prim_channel.super_sc_object._vptr_sc_object =
       (_func_int **)&PTR_print_00269f10;
  (this->super_sc_signal_channel).m_change_event_p = (sc_event *)0x0;
  (this->super_sc_signal_channel).m_change_stamp = 0xfffffffffffffffe;
  (this->super_sc_writer_policy_check<(sc_core::sc_writer_policy)1>).
  super_sc_writer_policy_check_delta.super_sc_writer_policy_check_write.m_delta_only = true;
  (this->super_sc_writer_policy_check<(sc_core::sc_writer_policy)1>).
  super_sc_writer_policy_check_delta.super_sc_writer_policy_check_write.m_writer_p.m_target_p =
       (sc_process_b *)0x0;
  sVar1 = (sc_signal_in_if<sc_dt::sc_logic>)*vtt;
  (this->super_sc_signal_inout_if<sc_dt::sc_logic>).super_sc_signal_in_if<sc_dt::sc_logic> = sVar1;
  *(void **)(&(this->super_sc_signal_inout_if<sc_dt::sc_logic>).
              super_sc_signal_in_if<sc_dt::sc_logic>.field_0x0 + *(long *)((long)sVar1 + -0x30)) =
       vtt[8];
  (this->super_sc_signal_inout_if<sc_dt::sc_logic>).super_sc_signal_write_if<sc_dt::sc_logic> =
       *(sc_signal_write_if<sc_dt::sc_logic> *)(vtt + 9);
  (this->super_sc_signal_channel).super_sc_prim_channel.super_sc_object._vptr_sc_object =
       (_func_int **)&PTR_print_002695c8;
  (this->m_cur_val).m_val = initial_value_->m_val;
  (this->m_new_val).m_val = initial_value_->m_val;
  return;
}

Assistant:

sc_signal_t( const char* name_, const T& initial_value_ )
      : base_type( name_ )
      , m_cur_val( initial_value_ )
      , m_new_val( initial_value_ )
    {}